

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O0

void __thiscall adios2::transport::FileFStream::Seek(FileFStream *this,size_t start)

{
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_b0 [24];
  undefined8 in_stack_ffffffffffffff68;
  string local_90 [16];
  FileFStream *in_stack_ffffffffffffff80;
  string local_70 [32];
  string local_50 [24];
  string *in_stack_ffffffffffffffc8;
  FileFStream *in_stack_ffffffffffffffd0;
  
  if (in_RSI == -1) {
    SeekToEnd(in_stack_ffffffffffffff80);
  }
  else {
    WaitForOpen(in_stack_ffffffffffffff80);
    std::ostream::seekp((long)(in_RDI + 8),(_Ios_Seekdir)in_RSI);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0;
    std::__cxx11::to_string(in_stack_ffffffffffffff68);
    std::operator+((char *)in_RDI,__rhs);
    std::operator+(in_RDI,(char *)__rhs);
    std::operator+(in_RDI,__rhs);
    std::operator+(in_RDI,(char *)__rhs);
    CheckFile(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
  }
  return;
}

Assistant:

void FileFStream::Seek(const size_t start)
{
    if (start != MaxSizeT)
    {
        WaitForOpen();
        m_FileStream.seekp(start, std::ios_base::beg);
        CheckFile("couldn't move to offset " + std::to_string(start) + " of file " + m_Name +
                  ", in call to fstream seekp");
    }
    else
    {
        SeekToEnd();
    }
}